

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O1

void __thiscall EchoServer::printThroughput(EchoServer *this)

{
  long lVar1;
  Timestamp TVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Timestamp local_48;
  Timestamp local_40;
  long local_38;
  
  TVar2 = sznet::Timestamp::now();
  local_38 = (this->m_transferred).super___atomic_base<long>._M_i;
  lVar5 = local_38 - this->m_oldCounter;
  LOCK();
  lVar1 = (this->m_receivedMessages).super___atomic_base<long>._M_i;
  (this->m_receivedMessages).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  local_40.m_microSecondsSinceEpoch = (this->m_startTime).m_microSecondsSinceEpoch;
  local_48 = TVar2;
  iVar3 = sznet::Timestamp::microSecondsSinceEpoch(&local_48);
  iVar4 = sznet::Timestamp::microSecondsSinceEpoch(&local_40);
  dVar6 = (double)(iVar3 - iVar4) / 1000000.0;
  dVar7 = (double)lVar5;
  dVar8 = (double)lVar1;
  printf("%4.3f MiB/s %4.3f Ki Msgs/s %6.2f bytes per msg\n",
         (dVar7 / dVar6) * 0.0009765625 * 0.0009765625,(dVar8 / dVar6) * 0.0009765625,dVar7 / dVar8)
  ;
  this->m_oldCounter = local_38;
  (this->m_startTime).m_microSecondsSinceEpoch = TVar2.m_microSecondsSinceEpoch;
  return;
}

Assistant:

void printThroughput()
    {
        Timestamp endTime = Timestamp::now();
        int64_t newCounter = m_transferred;
        int64_t bytes = newCounter - m_oldCounter;
        int64_t msgs = m_receivedMessages.exchange(0);
        double time = timeDifference(endTime, m_startTime);
        printf("%4.3f MiB/s %4.3f Ki Msgs/s %6.2f bytes per msg\n",
            static_cast<double>(bytes) / time / 1024 / 1024,
            static_cast<double>(msgs) / time / 1024,
            static_cast<double>(bytes) / static_cast<double>(msgs));

        m_oldCounter = newCounter;
        m_startTime = endTime;
    }